

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O3

void server_bpp_output_raw_data_callback(void *vctx)

{
  bufchain *ch;
  size_t sVar1;
  ulong uVar2;
  ptrlen pVar3;
  
  if (*(long *)((long)vctx + 0xd8) != 0) {
    ch = (bufchain *)((long)vctx + 0x28);
    do {
      sVar1 = bufchain_size(ch);
      if (sVar1 == 0) {
        if (*(char *)((long)vctx + 0x68) != '\x01') {
          return;
        }
        (**(code **)(**(long **)((long)vctx + 0xd8) + 8))();
        *(undefined8 *)((long)vctx + 0xd8) = 0;
        queue_toplevel_callback(ssh_server_free_callback,vctx);
        return;
      }
      pVar3 = bufchain_prefix(ch);
      sVar1 = pVar3.len;
      if (*(LogContext **)((long)vctx + 0xa8) != (LogContext *)0x0) {
        log_packet(*(LogContext **)((long)vctx + 0xa8),1,-1,(char *)0x0,pVar3.ptr,sVar1,0,
                   (logblank_t *)0x0,(unsigned_long *)0x0,0,(char *)0x0);
      }
      uVar2 = (**(code **)(**(long **)((long)vctx + 0xd8) + 0x10))
                        (*(long **)((long)vctx + 0xd8),pVar3.ptr,sVar1);
      bufchain_consume(ch,sVar1);
    } while (uVar2 < 0x8001);
  }
  return;
}

Assistant:

static void server_bpp_output_raw_data_callback(void *vctx)
{
    server *srv = (server *)vctx;

    if (!srv->socket)
        return;

    while (bufchain_size(&srv->out_raw) > 0) {
        size_t backlog;

        ptrlen data = bufchain_prefix(&srv->out_raw);

        if (srv->logctx)
            log_packet(srv->logctx, PKT_OUTGOING, -1, NULL, data.ptr, data.len,
                       0, NULL, NULL, 0, NULL);
        backlog = sk_write(srv->socket, data.ptr, data.len);

        bufchain_consume(&srv->out_raw, data.len);

        if (backlog > SSH_MAX_BACKLOG) {
#ifdef FIXME
            ssh_throttle_all(ssh, 1, backlog);
#endif
            return;
        }
    }

    if (srv->pending_close) {
        sk_close(srv->socket);
        srv->socket = NULL;
        queue_toplevel_callback(ssh_server_free_callback, srv);
    }
}